

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs2.c
# Opt level: O1

int Wlc_NtkAbsCore2(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  Wlc_Obj_t *pNode;
  uint *puVar1;
  ushort uVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  Abc_Cex_t *pCex;
  int iVar5;
  uint uVar6;
  int iVar7;
  Vec_Bit_t *vUnmark;
  int *piVar8;
  Vec_Int_t *vPisOld;
  Vec_Int_t *vPisNew;
  Vec_Int_t *vFlops;
  Vec_Bit_t *vLeaves;
  Wlc_Ntk_t *p_00;
  Gia_Man_t *pGVar9;
  Gia_Man_t *p_01;
  Aig_Man_t *pAig;
  void *pvVar10;
  Abc_Cex_t *p_02;
  void *pvVar11;
  byte bVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  char *__format;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  bool bVar27;
  timespec ts_1;
  Pdr_Par_t PdrPars;
  uint *local_160;
  uint local_148;
  int local_12c;
  long local_120;
  timespec local_100;
  Pdr_Par_t local_f0;
  
  iVar5 = clock_gettime(3,(timespec *)&local_f0);
  if (iVar5 < 0) {
    local_120 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_f0._8_8_),8);
    local_120 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_f0._0_8_ * -1000000;
  }
  iVar5 = ((p->iObj >> 5) + 1) - (uint)((p->iObj & 0x1fU) == 0);
  vUnmark = (Vec_Bit_t *)malloc(0x10);
  vUnmark->nSize = 0;
  vUnmark->nCap = iVar5 * 0x20;
  if (iVar5 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar5 * 4);
  }
  vUnmark->pArray = piVar8;
  vUnmark->nSize = iVar5 * 0x20;
  memset(piVar8,0,(long)iVar5 << 2);
  Pdr_ManSetDefaultParams(&local_f0);
  local_f0.fUseAbs = 1;
  local_f0.fSkipDown = 0;
  local_f0.fCtgs = 1;
  local_f0.fVerbose = pPars->fPdrVerbose;
  if (pPars->nIterMax < 2) {
    local_12c = -1;
    local_148 = 1;
  }
  else {
    local_148 = 1;
    do {
      if (pPars->fVerbose != 0) {
        printf("\nIteration %d:\n");
      }
      iVar5 = pPars->fVerbose;
      vPisOld = (Vec_Int_t *)malloc(0x10);
      vPisOld->nCap = 100;
      vPisOld->nSize = 0;
      piVar8 = (int *)malloc(400);
      vPisOld->pArray = piVar8;
      vPisNew = (Vec_Int_t *)malloc(0x10);
      vPisNew->nCap = 100;
      vPisNew->nSize = 0;
      piVar8 = (int *)malloc(400);
      vPisNew->pArray = piVar8;
      vFlops = (Vec_Int_t *)malloc(0x10);
      vFlops->nCap = 100;
      vFlops->nSize = 0;
      piVar8 = (int *)malloc(400);
      vFlops->pArray = piVar8;
      uVar15 = p->iObj;
      iVar24 = (((int)uVar15 >> 5) + 1) - (uint)((uVar15 & 0x1f) == 0);
      vLeaves = (Vec_Bit_t *)malloc(0x10);
      vLeaves->nSize = 0;
      uVar26 = iVar24 * 0x20;
      vLeaves->nCap = uVar26;
      if (iVar24 == 0) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = (int *)malloc((long)iVar24 * 4);
      }
      vLeaves->pArray = piVar8;
      vLeaves->nSize = uVar26;
      uVar19 = 0;
      memset(piVar8,0,(long)iVar24 << 2);
      uVar17 = 0;
      uVar6 = 0;
      uVar21 = 0;
      if (1 < (int)uVar15) {
        uVar20 = (ulong)uVar26;
        uVar26 = p->nObjsAlloc;
        if (p->nObjsAlloc < 2) {
          uVar26 = 1;
        }
        uVar21 = 0;
        uVar13 = 1;
        lVar16 = 0x24;
        uVar6 = 0;
        uVar17 = 0;
        uVar19 = 0;
        do {
          if (uVar26 == uVar13) goto LAB_0088decd;
          if ((long)vUnmark->nSize <= (long)uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          if (((uint)vUnmark->pArray[uVar13 >> 5 & 0x7ffffff] >> ((uint)uVar13 & 0x1f) & 1) == 0) {
            pWVar4 = p->pObjs;
            uVar2 = *(ushort *)((long)pWVar4 + lVar16 + -0xc);
            uVar22 = uVar2 & 0x3f;
            bVar12 = (byte)uVar13;
            if (uVar22 < 0x33) {
              if ((0x1e00000000000U >> uVar22 & 1) == 0) {
                if ((0x4180000000000U >> uVar22 & 1) == 0) {
                  if (uVar22 != 8) goto LAB_0088d4a4;
                  iVar23 = *(int *)((long)pWVar4 + lVar16 + -4) -
                           *(int *)(&pWVar4->field_0x0 + lVar16);
                  iVar24 = -iVar23;
                  if (0 < iVar23) {
                    iVar24 = iVar23;
                  }
                  if (pPars->nBitsMux <= iVar24 + 1) {
                    if (uVar20 <= uVar13) goto LAB_0088df0b;
                    piVar8[uVar13 >> 5 & 0x7ffffff] =
                         piVar8[uVar13 >> 5 & 0x7ffffff] | 1 << (bVar12 & 0x1f);
                    uVar6 = uVar6 + 1;
                  }
                }
                else {
                  iVar23 = *(int *)((long)pWVar4 + lVar16 + -4) -
                           *(int *)(&pWVar4->field_0x0 + lVar16);
                  iVar24 = -iVar23;
                  if (0 < iVar23) {
                    iVar24 = iVar23;
                  }
                  if (pPars->nBitsAdd <= iVar24 + 1) {
                    if (uVar20 <= uVar13) goto LAB_0088df0b;
                    piVar8[uVar13 >> 5 & 0x7ffffff] =
                         piVar8[uVar13 >> 5 & 0x7ffffff] | 1 << (bVar12 & 0x1f);
                    uVar19 = uVar19 + 1;
                  }
                }
              }
              else {
                iVar23 = *(int *)((long)pWVar4 + lVar16 + -4) -
                         *(int *)(&pWVar4->field_0x0 + lVar16);
                iVar24 = -iVar23;
                if (0 < iVar23) {
                  iVar24 = iVar23;
                }
                if (pPars->nBitsMul <= iVar24 + 1) {
                  if (uVar20 <= uVar13) {
LAB_0088df0b:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                  ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                  }
                  piVar8[uVar13 >> 5 & 0x7ffffff] =
                       piVar8[uVar13 >> 5 & 0x7ffffff] | 1 << (bVar12 & 0x1f);
                  uVar17 = (ulong)((int)uVar17 + 1);
                }
              }
            }
            else {
LAB_0088d4a4:
              if ((short)uVar22 != 1 && (uVar2 & 0x3d) == 1) {
                iVar23 = *(int *)((long)pWVar4 + lVar16 + -4) -
                         *(int *)(&pWVar4->field_0x0 + lVar16);
                iVar24 = -iVar23;
                if (0 < iVar23) {
                  iVar24 = iVar23;
                }
                if (pPars->nBitsFlop <= iVar24 + 1) {
                  if (uVar20 <= uVar13) goto LAB_0088df0b;
                  piVar8[uVar13 >> 5 & 0x7ffffff] =
                       piVar8[uVar13 >> 5 & 0x7ffffff] | 1 << (bVar12 & 0x1f);
                  uVar21 = (ulong)((int)uVar21 + 1);
                }
              }
            }
          }
          uVar13 = uVar13 + 1;
          lVar16 = lVar16 + 0x18;
        } while (uVar15 != uVar13);
      }
      if (iVar5 != 0) {
        printf("Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away.\n"
               ,(ulong)uVar19,uVar17,(ulong)uVar6,uVar21);
      }
      Wlc_NtkCleanMarks(p);
      if (0 < (p->vCos).nSize) {
        lVar16 = 0;
        do {
          iVar5 = (p->vCos).pArray[lVar16];
          if (((long)iVar5 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0088decd;
          Wlc_NtkAbsMarkNodes_rec(p,p->pObjs + iVar5,vLeaves,vPisOld,vPisNew,vFlops);
          lVar16 = lVar16 + 1;
        } while (lVar16 < (p->vCos).nSize);
      }
      if (0 < vFlops->nSize) {
        lVar16 = 0;
        do {
          lVar18 = (long)vFlops->pArray[lVar16];
          if ((lVar18 < 1) || (p->nObjsAlloc <= vFlops->pArray[lVar16])) goto LAB_0088decd;
          pWVar4 = p->pObjs;
          if ((undefined1  [24])((undefined1  [24])pWVar4[lVar18] & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x3) {
LAB_0088df2a:
            __assert_fail("pObj->Type == WLC_OBJ_FO",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                          ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
          }
          uVar15 = (pWVar4[lVar18].field_10.Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
          if (((int)uVar15 < 0) || ((p->vCos).nSize <= (int)uVar15)) {
LAB_0088deae:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar5 = (p->vCos).pArray[uVar15];
          if (((long)iVar5 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0088decd;
          Wlc_NtkAbsMarkNodes_rec(p,pWVar4 + iVar5,vLeaves,vPisOld,vPisNew,vFlops);
          lVar16 = lVar16 + 1;
        } while (lVar16 < vFlops->nSize);
      }
      if (1 < p->iObj) {
        iVar5 = p->nObjsAlloc;
        if (iVar5 < 2) {
          iVar5 = 1;
        }
        if (iVar5 - 1U <= p->iObj - 2U) {
LAB_0088decd:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
      }
      qsort(vPisOld->pArray,(long)vPisOld->nSize,4,Vec_IntSortCompare1);
      qsort(vPisNew->pArray,(long)vPisNew->nSize,4,Vec_IntSortCompare1);
      qsort(vFlops->pArray,(long)vFlops->nSize,4,Vec_IntSortCompare1);
      Wlc_NtkCleanMarks(p);
      if (piVar8 != (int *)0x0) {
        free(piVar8);
        vLeaves->pArray = (int *)0x0;
      }
      free(vLeaves);
      p_00 = Wlc_NtkDupDfsAbs(p,vPisOld,vPisNew,vFlops);
      if (vPisOld->pArray != (int *)0x0) {
        free(vPisOld->pArray);
        vPisOld->pArray = (int *)0x0;
      }
      free(vPisOld);
      if (vFlops->pArray != (int *)0x0) {
        free(vFlops->pArray);
        vFlops->pArray = (int *)0x0;
      }
      free(vFlops);
      pGVar9 = Wlc_NtkBitBlast(p_00,(Wlc_BstPar_t *)0x0);
      iVar5 = Wlc_NtkDcFlopNum(p_00);
      p_01 = pGVar9;
      if (0 < iVar5) {
        iVar24 = Wlc_NtkCountObjBits(p,vPisNew);
        p_01 = Gia_ManPermuteInputs(pGVar9,iVar24,iVar5);
        Gia_ManStop(pGVar9);
      }
      pGVar9 = p_01;
      if (pPars->fXorOutput != 0) {
        pGVar9 = Gia_ManTransformMiter2(p_01);
        Gia_ManStop(p_01);
      }
      if (pPars->fVerbose != 0) {
        printf("Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n",
               (ulong)(p_00->iObj - 1),(ulong)(uint)vPisNew->nSize);
        Gia_ManPrintStats(pGVar9,(Gps_Par_t *)0x0);
      }
      Wlc_NtkFree(p_00);
      pAig = Gia_ManToAigSimple(pGVar9);
      local_12c = Pdr_ManSolve(pAig,&local_f0);
      pCex = pAig->pSeqModel;
      pAig->pSeqModel = (Abc_Cex_t *)0x0;
      Aig_ManStop(pAig);
      if (pCex == (Abc_Cex_t *)0x0) {
        if (local_12c == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                        ,0x16d,"int Wlc_NtkAbsCore2(Wlc_Ntk_t *, Wlc_Par_t *)");
        }
        Gia_ManStop(pGVar9);
        if (vPisNew->pArray != (int *)0x0) {
          free(vPisNew->pArray);
          vPisNew->pArray = (int *)0x0;
        }
        free(vPisNew);
        break;
      }
      local_160 = (uint *)malloc(0x10);
      local_160[0] = 100;
      local_160[1] = 0;
      pvVar10 = malloc(400);
      *(void **)(local_160 + 2) = pvVar10;
      iVar5 = pCex->nPis;
      iVar24 = iVar5;
      if (iVar5 - 1U < 0xf) {
        iVar24 = 0x10;
      }
      if (iVar24 == 0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = malloc((long)iVar24 << 2);
      }
      if (pvVar10 != (void *)0x0) {
        memset(pvVar10,0xff,(long)iVar5 * 4);
      }
      iVar24 = vPisNew->nSize;
      if ((long)iVar24 < 1) {
        iVar23 = 0;
      }
      else {
        piVar8 = vPisNew->pArray;
        lVar16 = 0;
        iVar7 = 0;
        do {
          iVar23 = iVar7;
          iVar7 = piVar8[lVar16];
          lVar18 = (long)iVar7;
          if ((lVar18 < 1) || (p->nObjsAlloc <= iVar7)) goto LAB_0088decd;
          pWVar4 = p->pObjs;
          iVar25 = iVar5;
          if (iVar5 < iVar23) {
            iVar25 = iVar23;
          }
          uVar15 = 0;
          do {
            if ((iVar23 - iVar25) + uVar15 == 0) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)((long)pvVar10 + (ulong)(iVar23 + uVar15) * 4) = iVar7;
            uVar26 = uVar15 + 1;
            uVar6 = pWVar4[lVar18].End - pWVar4[lVar18].Beg;
            uVar19 = -uVar6;
            if (0 < (int)uVar6) {
              uVar19 = uVar6;
            }
            bVar27 = uVar15 < uVar19;
            uVar15 = uVar26;
          } while (bVar27);
          lVar16 = lVar16 + 1;
          iVar7 = iVar23 + uVar26;
        } while (lVar16 != iVar24);
        iVar23 = iVar23 + uVar26;
      }
      iVar23 = iVar5 - iVar23;
      p_02 = Bmc_CexCareMinimizeAig(pGVar9,iVar23,pCex,1,0,0);
      if (p_02->nPis != pCex->nPis) {
        __assert_fail("pCexCare->nPis == pCex->nPis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                      ,0xcf,
                      "Vec_Int_t *Wlc_NtkAbsRefinement(Wlc_Ntk_t *, Gia_Man_t *, Abc_Cex_t *, Vec_Int_t *)"
                     );
      }
      if (-1 < p_02->iFrame) {
        iVar24 = 0;
        do {
          iVar7 = p_02->nPis;
          iVar25 = iVar23;
          if (iVar23 < iVar7) {
            do {
              uVar15 = iVar7 * iVar24 + iVar25 + p_02->nRegs;
              if (((uint)(&p_02[1].iPo)[(int)uVar15 >> 5] >> (uVar15 & 0x1f) & 1) != 0) {
                uVar15 = iVar25 - iVar23;
                if (((int)uVar15 < 0) || (iVar5 <= (int)uVar15)) goto LAB_0088deae;
                iVar7 = *(int *)((long)pvVar10 + (ulong)uVar15 * 4);
                uVar15 = local_160[1];
                lVar16 = (long)(int)uVar15;
                if (0 < lVar16) {
                  lVar18 = 0;
                  do {
                    if (*(int *)(*(long *)(local_160 + 2) + lVar18 * 4) == iVar7) goto LAB_0088dad1;
                    lVar18 = lVar18 + 1;
                  } while (lVar16 != lVar18);
                }
                uVar26 = *local_160;
                if (uVar15 == uVar26) {
                  if ((int)uVar26 < 0x10) {
                    if (*(void **)(local_160 + 2) == (void *)0x0) {
                      pvVar11 = malloc(0x40);
                    }
                    else {
                      pvVar11 = realloc(*(void **)(local_160 + 2),0x40);
                    }
                    *(void **)(local_160 + 2) = pvVar11;
                    uVar19 = 0x10;
                  }
                  else {
                    uVar19 = uVar26 * 2;
                    if ((int)uVar19 <= (int)uVar26) goto LAB_0088da9d;
                    if (*(void **)(local_160 + 2) == (void *)0x0) {
                      pvVar11 = malloc((ulong)uVar26 << 3);
                    }
                    else {
                      pvVar11 = realloc(*(void **)(local_160 + 2),(ulong)uVar26 << 3);
                    }
                    *(void **)(local_160 + 2) = pvVar11;
                  }
                  if (pvVar11 == (void *)0x0) {
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                  *local_160 = uVar19;
                }
LAB_0088da9d:
                local_160[1] = uVar15 + 1;
                if (0 < (int)uVar15) {
                  lVar18 = *(long *)(local_160 + 2);
                  do {
                    iVar3 = *(int *)(lVar18 + -4 + lVar16 * 4);
                    if (iVar3 <= iVar7) goto LAB_0088dac6;
                    *(int *)(lVar18 + lVar16 * 4) = iVar3;
                    bVar27 = 1 < lVar16;
                    lVar16 = lVar16 + -1;
                  } while (bVar27);
                  lVar16 = 0;
                }
LAB_0088dac6:
                *(int *)(*(long *)(local_160 + 2) + (long)(int)lVar16 * 4) = iVar7;
              }
LAB_0088dad1:
              iVar25 = iVar25 + 1;
              iVar7 = p_02->nPis;
            } while (iVar25 < iVar7);
          }
          bVar27 = iVar24 < p_02->iFrame;
          iVar24 = iVar24 + 1;
        } while (bVar27);
      }
      Abc_CexFree(p_02);
      if (pvVar10 != (void *)0x0) {
        free(pvVar10);
      }
      if (local_160[1] == 0) {
        if (*(void **)(local_160 + 2) != (void *)0x0) {
          free(*(void **)(local_160 + 2));
          local_160[2] = 0;
          local_160[3] = 0;
        }
        free(local_160);
        local_160 = (uint *)0x0;
      }
      Gia_ManStop(pGVar9);
      if (vPisNew->pArray != (int *)0x0) {
        free(vPisNew->pArray);
        vPisNew->pArray = (int *)0x0;
      }
      free(vPisNew);
      if (local_160 == (uint *)0x0) {
        Abc_CexFree(pCex);
        break;
      }
      if ((p->vRefs).nSize == 0) {
        Wlc_NtkSetRefs(p);
      }
      if ((int)local_160[1] < 1) {
        uVar15 = 0;
      }
      else {
        lVar16 = 0;
        uVar15 = 0;
        do {
          iVar5 = *(int *)(*(long *)(local_160 + 2) + lVar16 * 4);
          lVar18 = (long)iVar5;
          if ((lVar18 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0088decd;
          pWVar4 = p->pObjs;
          while (pNode = pWVar4 + lVar18,
                (undefined1  [24])((undefined1  [24])*pNode & (undefined1  [24])0x3d) ==
                (undefined1  [24])0x1) {
            lVar18 = ((long)pNode - (long)pWVar4 >> 3) * -0x5555555555555555;
            uVar26 = (uint)lVar18;
            if (((int)uVar26 < 0) || (vUnmark->nSize <= (int)uVar26)) goto LAB_0088df0b;
            puVar1 = (uint *)((long)vUnmark->pArray + (ulong)(uVar26 >> 3 & 0xffffffc));
            *puVar1 = *puVar1 | 1 << ((byte)lVar18 & 0x1f);
            if ((undefined1  [24])((undefined1  [24])*pNode & (undefined1  [24])0x3f) !=
                (undefined1  [24])0x3) goto LAB_0088df2a;
            uVar26 = ((pNode->field_10).Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
            if (((int)uVar26 < 0) || ((p->vCos).nSize <= (int)uVar26)) goto LAB_0088deae;
            iVar5 = (p->vCos).pArray[uVar26];
            lVar18 = (long)iVar5;
            if ((lVar18 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0088decd;
          }
          iVar5 = Wlc_NtkNodeDeref_rec(p,pNode,vUnmark);
          iVar24 = Wlc_NtkNodeRef_rec(p,pNode);
          if (iVar5 != iVar24) {
            __assert_fail("Count1 == Count2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                          ,0x111,"int Wlc_NtkMarkMffc(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Bit_t *)");
          }
          uVar15 = uVar15 + iVar5;
          lVar16 = lVar16 + 1;
        } while (lVar16 < (int)local_160[1]);
      }
      if (pPars->fVerbose != 0) {
        printf("Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n"
               ,(ulong)(uint)pCex->iFrame,(ulong)local_160[1],(ulong)uVar15);
      }
      if (*(void **)(local_160 + 2) != (void *)0x0) {
        free(*(void **)(local_160 + 2));
        local_160[2] = 0;
        local_160[3] = 0;
      }
      free(local_160);
      Abc_CexFree(pCex);
      local_148 = local_148 + 1;
    } while ((int)local_148 < pPars->nIterMax);
  }
  if (vUnmark->pArray != (int *)0x0) {
    free(vUnmark->pArray);
    vUnmark->pArray = (int *)0x0;
  }
  free(vUnmark);
  if (pPars->fVerbose != 0) {
    putchar(10);
  }
  printf("Abstraction ");
  pcVar14 = "timed out";
  if (local_12c == 1) {
    pcVar14 = "is successfully proved";
  }
  __format = "resulted in a real CEX";
  if (local_12c != 0) {
    __format = pcVar14;
  }
  printf(__format);
  printf(" after %d iterations. ",(ulong)local_148);
  iVar24 = 3;
  iVar5 = clock_gettime(3,&local_100);
  if (iVar5 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
  }
  Abc_Print(iVar24,"%s =","Time");
  Abc_Print(iVar24,"%9.2f sec\n",(double)(lVar16 + local_120) / 1000000.0);
  return local_12c;
}

Assistant:

int Wlc_NtkAbsCore2( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    int nIters, nNodes, nDcFlops, RetValue = -1;
    // start the bitmap to mark objects that cannot be abstracted because of refinement
    // currently, this bitmap is empty because abstraction begins without refinement
    Vec_Bit_t * vUnmark = Vec_BitStart( Wlc_NtkObjNumMax(p) );
    // set up parameters to run PDR
    Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
    Pdr_ManSetDefaultParams( pPdrPars );
    pPdrPars->fUseAbs    = 1;   // use 'pdr -t'  (on-the-fly abstraction)
    pPdrPars->fCtgs      = 1;   // use 'pdr -nc' (improved generalization)
    pPdrPars->fSkipDown  = 0;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->nRestLimit = 500; // reset queue or proof-obligations when it gets larger than this
    pPdrPars->fVerbose   = pPars->fPdrVerbose;
    // perform refinement iterations
    for ( nIters = 1; nIters < pPars->nIterMax; nIters++ )
    {
        Aig_Man_t * pAig;
        Abc_Cex_t * pCex;
        Vec_Int_t * vPisNew, * vRefine;  
        Gia_Man_t * pGia, * pTemp;
        Wlc_Ntk_t * pAbs;

        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", nIters );

        // get abstracted GIA and the set of pseudo-PIs (vPisNew)
        pAbs = Wlc_NtkAbs( p, pPars, vUnmark, &vPisNew, pPars->fVerbose );
        pGia = Wlc_NtkBitBlast( pAbs, NULL );

        // if the abstraction has flops with DC-init state,
        // new PIs were introduced by bit-blasting at the end of the PI list
        // here we move these variables to be *before* PPIs, because
        // PPIs are supposed to be at the end of the PI list for refinement
        nDcFlops = Wlc_NtkDcFlopNum(pAbs);
        if ( nDcFlops > 0 ) // DC-init flops are present
        {
            pGia = Gia_ManPermuteInputs( pTemp = pGia, Wlc_NtkCountObjBits(p, vPisNew), nDcFlops );
            Gia_ManStop( pTemp );
        }
        // if the word-level outputs have to be XORs, this is a place to do it
        if ( pPars->fXorOutput )
        {
            pGia = Gia_ManTransformMiter2( pTemp = pGia );
            Gia_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
        {
            printf( "Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n", Wlc_NtkObjNum(pAbs), Vec_IntSize(vPisNew) ); 
            Gia_ManPrintStats( pGia, NULL );
        }
        Wlc_NtkFree( pAbs );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pGia );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        // consider outcomes
        if ( pCex == NULL ) 
        {
            assert( RetValue ); // proved or undecided
            Gia_ManStop( pGia );
            Vec_IntFree( vPisNew );
            break;
        }

        // perform refinement
        vRefine = Wlc_NtkAbsRefinement( p, pGia, pCex, vPisNew );
        Gia_ManStop( pGia );
        Vec_IntFree( vPisNew );
        if ( vRefine == NULL ) // real CEX
        {
            Abc_CexFree( pCex ); // return CEX in the future
            break;
        }

        // update the set of objects to be un-abstracted
        nNodes = Wlc_NtkRemoveFromAbstraction( p, vRefine, vUnmark );
        if ( pPars->fVerbose )
            printf( "Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n", pCex->iFrame, Vec_IntSize(vRefine), nNodes );
        Vec_IntFree( vRefine );
        Abc_CexFree( pCex );
    }
    Vec_BitFree( vUnmark );
    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}